

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

void ImPlot::PlotVLines<unsigned_int>(char *label_id,uint *xs,int count,int offset,int stride)

{
  bool bVar1;
  ImPlotScale IVar2;
  TransformerLogLog local_c4;
  TransformerLinLog local_c0;
  TransformerLogLin local_bc;
  TransformerLinLin local_b8;
  ImU32 local_b4;
  ImDrawList *pIStack_b0;
  ImU32 col_line;
  ImDrawList *DrawList;
  ImPlotNextItemData *s;
  int local_8c;
  undefined1 local_88 [4];
  int i;
  GetterXsYRef<unsigned_int> get_max;
  GetterXsYRef<unsigned_int> get_min;
  ImPlotLimits lims;
  int stride_local;
  int offset_local;
  int count_local;
  uint *xs_local;
  char *label_id_local;
  
  bVar1 = BeginItem(label_id,0);
  if (bVar1) {
    GetPlotLimits((ImPlotLimits *)&get_min.Stride,-1);
    GetterXsYRef<unsigned_int>::GetterXsYRef
              ((GetterXsYRef<unsigned_int> *)&get_max.Stride,xs,lims.X.Max,count,offset,stride);
    GetterXsYRef<unsigned_int>::GetterXsYRef
              ((GetterXsYRef<unsigned_int> *)local_88,xs,lims.Y.Min,count,offset,stride);
    bVar1 = FitThisFrame();
    if (bVar1) {
      for (local_8c = 0; local_8c < get_min.YRef._0_4_; local_8c = local_8c + 1) {
        _s = GetterXsYRef<unsigned_int>::operator()
                       ((GetterXsYRef<unsigned_int> *)&get_max.Stride,local_8c);
        FitPointX((double)s);
      }
    }
    DrawList = (ImDrawList *)GetItemData();
    pIStack_b0 = GetPlotDrawList();
    if (((ulong)(DrawList->_TextureIdStack).Data & 0x100000000) != 0) {
      local_b4 = ImGui::GetColorU32((ImVec4 *)DrawList);
      IVar2 = GetCurrentScale();
      switch(IVar2) {
      case 0:
        TransformerLinLin::TransformerLinLin(&local_b8);
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLinLin>
                  ((GetterXsYRef<unsigned_int> *)&get_max.Stride,
                   (GetterXsYRef<unsigned_int> *)local_88,&local_b8,pIStack_b0,
                   *(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 1:
        TransformerLogLin::TransformerLogLin(&local_bc);
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLogLin>
                  ((GetterXsYRef<unsigned_int> *)&get_max.Stride,
                   (GetterXsYRef<unsigned_int> *)local_88,&local_bc,pIStack_b0,
                   *(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 2:
        TransformerLinLog::TransformerLinLog(&local_c0);
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLinLog>
                  ((GetterXsYRef<unsigned_int> *)&get_max.Stride,
                   (GetterXsYRef<unsigned_int> *)local_88,&local_c0,pIStack_b0,
                   *(float *)&DrawList->_IdxWritePtr,local_b4);
        break;
      case 3:
        TransformerLogLog::TransformerLogLog(&local_c4);
        RenderLineSegments<ImPlot::GetterXsYRef<unsigned_int>,ImPlot::GetterXsYRef<unsigned_int>,ImPlot::TransformerLogLog>
                  ((GetterXsYRef<unsigned_int> *)&get_max.Stride,
                   (GetterXsYRef<unsigned_int> *)local_88,&local_c4,pIStack_b0,
                   *(float *)&DrawList->_IdxWritePtr,local_b4);
      }
    }
    EndItem();
  }
  return;
}

Assistant:

void PlotVLines(const char* label_id, const T* xs, int count, int offset, int stride) {
    if (BeginItem(label_id, ImPlotCol_Line)) {
        const ImPlotLimits lims = GetPlotLimits();
        GetterXsYRef<T> get_min(xs,lims.Y.Min,count,offset,stride);
        GetterXsYRef<T> get_max(xs,lims.Y.Max,count,offset,stride);
        if (FitThisFrame()) {
            for (int i = 0; i < get_min.Count; ++i)
                FitPointX(get_min(i).x);
        }
        const ImPlotNextItemData& s = GetItemData();
        ImDrawList& DrawList = *GetPlotDrawList();
        // render stems
        if (s.RenderLine) {
            const ImU32 col_line = ImGui::GetColorU32(s.Colors[ImPlotCol_Line]);
            switch (GetCurrentScale()) {
                case ImPlotScale_LinLin: RenderLineSegments(get_min, get_max, TransformerLinLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLin: RenderLineSegments(get_min, get_max, TransformerLogLin(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LinLog: RenderLineSegments(get_min, get_max, TransformerLinLog(), DrawList, s.LineWeight, col_line); break;
                case ImPlotScale_LogLog: RenderLineSegments(get_min, get_max, TransformerLogLog(), DrawList, s.LineWeight, col_line); break;
            }
        }
        EndItem();
    }
}